

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_DACCtrl_Stop(VGMPlayer *this)

{
  size_t sVar1;
  pointer pDVar2;
  ulong uVar3;
  long lVar4;
  
  if ((ulong)this->_fileData[(ulong)this->_filePos + 1] == 0xff) {
    pDVar2 = (this->_dacStreams).
             super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_dacStreams).
        super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
        super__Vector_impl_data._M_finish != pDVar2) {
      lVar4 = 0;
      uVar3 = 0;
      do {
        *(undefined4 *)((long)&pDVar2->lastItem + lVar4) = 0xffffffff;
        daccontrol_stop(*(void **)((long)&(pDVar2->defInf).dataPtr + lVar4));
        uVar3 = uVar3 + 1;
        pDVar2 = (this->_dacStreams).
                 super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x38;
      } while (uVar3 < (ulong)(((long)(this->_dacStreams).
                                      super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2 >> 3
                               ) * 0x6db6db6db6db6db7));
    }
  }
  else {
    sVar1 = this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]];
    if (sVar1 != 0xffffffffffffffff) {
      pDVar2 = (this->_dacStreams).
               super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar2[sVar1].lastItem = 0xffffffff;
      daccontrol_stop(pDVar2[sVar1].defInf.dataPtr);
      return;
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_Stop(void)	// DAC Stream Control: Stop immediately
{
	if (fData[0x01] == 0xFF)
	{
		for (size_t curStrm = 0; curStrm < _dacStreams.size(); curStrm++)
		{
			DACSTRM_DEV* dacStrm = &_dacStreams[curStrm];
			dacStrm->lastItem = (UINT32)-1;
			daccontrol_stop(dacStrm->defInf.dataPtr);
		}
		return;
	}
	
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
		return;
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	
	dacStrm->lastItem = (UINT32)-1;
	daccontrol_stop(dacStrm->defInf.dataPtr);
	return;
}